

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_chvalid(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int test_ret_3;
  int n_ch;
  uint uVar10;
  undefined4 uVar11;
  undefined4 *puVar12;
  int test_ret;
  int iVar13;
  int test_ret_2;
  int test_ret_1;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing chvalid : 9 of 9 functions ...");
  }
  puVar12 = &DAT_001521ec;
  iVar13 = 0;
  uVar10 = 0;
  do {
    iVar1 = xmlMemBlocks();
    uVar11 = 0xffffffff;
    if (uVar10 < 3) {
      uVar11 = *puVar12;
    }
    xmlCharInRange(uVar11,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCharInRange",(ulong)(uint)(iVar2 - iVar1));
      iVar13 = iVar13 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar10 = uVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar10 != 3);
  function_tests = function_tests + 1;
  puVar12 = &DAT_001521ec;
  uVar10 = 0;
  local_34 = 0;
  do {
    iVar1 = xmlMemBlocks();
    uVar11 = 0xffffffff;
    if (uVar10 < 3) {
      uVar11 = *puVar12;
    }
    xmlIsBaseChar(uVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsBaseChar",(ulong)(uint)(iVar2 - iVar1));
      local_34 = local_34 + 1;
      printf(" %d",(ulong)uVar10);
      putchar(10);
    }
    uVar10 = uVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar10 != 3);
  function_tests = function_tests + 1;
  puVar12 = &DAT_001521ec;
  uVar10 = 0;
  iVar1 = 0;
  do {
    iVar2 = xmlMemBlocks();
    uVar11 = 0xffffffff;
    if (uVar10 < 3) {
      uVar11 = *puVar12;
    }
    xmlIsBlank(uVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsBlank",(ulong)(uint)(iVar3 - iVar2));
      iVar1 = iVar1 + 1;
      printf(" %d",(ulong)uVar10);
      putchar(10);
    }
    uVar10 = uVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar10 != 3);
  function_tests = function_tests + 1;
  puVar12 = &DAT_001521ec;
  uVar10 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    uVar11 = 0xffffffff;
    if (uVar10 < 3) {
      uVar11 = *puVar12;
    }
    xmlIsChar(uVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsChar",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",(ulong)uVar10);
      putchar(10);
    }
    uVar10 = uVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar10 != 3);
  function_tests = function_tests + 1;
  puVar12 = &DAT_001521ec;
  uVar10 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    uVar11 = 0xffffffff;
    if (uVar10 < 3) {
      uVar11 = *puVar12;
    }
    xmlIsCombining(uVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsCombining",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",(ulong)uVar10);
      putchar(10);
    }
    uVar10 = uVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar10 != 3);
  function_tests = function_tests + 1;
  puVar12 = &DAT_001521ec;
  uVar10 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    uVar11 = 0xffffffff;
    if (uVar10 < 3) {
      uVar11 = *puVar12;
    }
    xmlIsDigit(uVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsDigit",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",(ulong)uVar10);
      putchar(10);
    }
    uVar10 = uVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar10 != 3);
  function_tests = function_tests + 1;
  puVar12 = &DAT_001521ec;
  uVar10 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    uVar11 = 0xffffffff;
    if (uVar10 < 3) {
      uVar11 = *puVar12;
    }
    xmlIsExtender(uVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsExtender",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",(ulong)uVar10);
      putchar(10);
    }
    uVar10 = uVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar10 != 3);
  function_tests = function_tests + 1;
  puVar12 = &DAT_001521ec;
  uVar10 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    uVar11 = 0xffffffff;
    if (uVar10 < 3) {
      uVar11 = *puVar12;
    }
    xmlIsIdeographic(uVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsIdeographic",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",(ulong)uVar10);
      putchar(10);
    }
    uVar10 = uVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar10 != 3);
  function_tests = function_tests + 1;
  puVar12 = &DAT_001521ec;
  uVar10 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    uVar11 = 0xffffffff;
    if (uVar10 < 3) {
      uVar11 = *puVar12;
    }
    xmlIsPubidChar(uVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsPubidChar",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",(ulong)uVar10);
      putchar(10);
    }
    uVar10 = uVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (uVar10 != 3);
  function_tests = function_tests + 1;
  uVar10 = local_34 + iVar13 + iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7;
  if (uVar10 != 0) {
    printf("Module chvalid: %d errors\n",(ulong)uVar10);
  }
  return uVar10;
}

Assistant:

static int
test_chvalid(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing chvalid : 9 of 9 functions ...\n");
    test_ret += test_xmlCharInRange();
    test_ret += test_xmlIsBaseChar();
    test_ret += test_xmlIsBlank();
    test_ret += test_xmlIsChar();
    test_ret += test_xmlIsCombining();
    test_ret += test_xmlIsDigit();
    test_ret += test_xmlIsExtender();
    test_ret += test_xmlIsIdeographic();
    test_ret += test_xmlIsPubidChar();

    if (test_ret != 0)
	printf("Module chvalid: %d errors\n", test_ret);
    return(test_ret);
}